

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

uint prvTidyNodeAttributeVersions(Node *node,TidyAttrId id)

{
  uint local_20;
  uint i;
  TidyAttrId id_local;
  Node *node_local;
  
  if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
     (node->tag->attrvers != (AttrVersion *)0x0)) {
    local_20 = 0;
    while (node->tag->attrvers[local_20].attribute != TidyAttr_UNKNOWN) {
      if (node->tag->attrvers[local_20].attribute == id) {
        return node->tag->attrvers[local_20].versions;
      }
      local_20 = local_20 + 1;
    }
  }
  return 0;
}

Assistant:

uint TY_(NodeAttributeVersions)( Node* node, TidyAttrId id )
{
    uint i;

    if (!node || !node->tag || !node->tag->attrvers)
        return VERS_UNKNOWN;

    for (i = 0; node->tag->attrvers[i].attribute; ++i)
        if (node->tag->attrvers[i].attribute == id)
            return node->tag->attrvers[i].versions;

    return VERS_UNKNOWN;
}